

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O2

void __thiscall
DHUDMessageTypeOnFadeOut::DHUDMessageTypeOnFadeOut
          (DHUDMessageTypeOnFadeOut *this,FFont *font,char *text,float x,float y,int hudwidth,
          int hudheight,EColorRange textColor,float typeTime,float holdTime,float fadeOutTime)

{
  uint uVar1;
  
  DHUDMessageFadeOut::DHUDMessageFadeOut
            (&this->super_DHUDMessageFadeOut,font,text,x,y,hudwidth,hudheight,textColor,holdTime,
             fadeOutTime);
  (this->super_DHUDMessageFadeOut).super_DHUDMessage.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00702540;
  uVar1 = -(uint)(typeTime * 35.0 == 0.0);
  *(uint *)&(this->super_DHUDMessageFadeOut).field_0xc4 =
       ~uVar1 & (uint)(typeTime * 35.0) | uVar1 & 0x3dcccccd;
  this->CurrLine = 0;
  this->LineLen =
       *(int *)((((this->super_DHUDMessageFadeOut).super_DHUDMessage.Lines)->Text).Chars + -0xc);
  this->LineVisible = 0;
  (this->super_DHUDMessageFadeOut).super_DHUDMessage.State = 3;
  return;
}

Assistant:

DHUDMessageTypeOnFadeOut::DHUDMessageTypeOnFadeOut (FFont *font, const char *text, float x, float y,
	int hudwidth, int hudheight,
	EColorRange textColor, float typeTime, float holdTime, float fadeOutTime)
	: DHUDMessageFadeOut (font, text, x, y, hudwidth, hudheight, textColor, holdTime, fadeOutTime)
{
	TypeOnTime = typeTime * TICRATE;
	if (TypeOnTime == 0.f)
		TypeOnTime = 0.1f;
	CurrLine = 0;
	LineLen = (int)Lines[0].Text.Len();
	LineVisible = 0;
	State = 3;
}